

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_simplification.cpp
# Opt level: O1

void __thiscall
duckdb::ConjunctionSimplificationRule::ConjunctionSimplificationRule
          (ConjunctionSimplificationRule *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var2;
  pointer pCVar3;
  templated_unique_single_t op;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_20;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_18;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_019aa438;
  local_20._M_head_impl = (ExpressionMatcher *)operator_new(0x40);
  (local_20._M_head_impl)->expr_class = BOUND_CONJUNCTION;
  ((local_20._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  ((local_20._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = (TypeMatcher *)0x0;
  (local_20._M_head_impl)->_vptr_ExpressionMatcher =
       (_func_int **)&PTR__ConjunctionExpressionMatcher_019cb0d8;
  local_20._M_head_impl[1]._vptr_ExpressionMatcher = (_func_int **)0x0;
  *(undefined8 *)&local_20._M_head_impl[1].expr_class = 0;
  local_20._M_head_impl[1].expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  *(undefined4 *)
   &local_20._M_head_impl[1].type.
    super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
    super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
    super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = 4;
  pCVar3 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_20);
  local_18._M_head_impl = (ExpressionMatcher *)operator_new(0x20);
  (local_18._M_head_impl)->expr_class = INVALID;
  ((local_18._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>)0x0;
  ((local_18._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::TypeMatcher_*,_false>)0x0;
  (local_18._M_head_impl)->_vptr_ExpressionMatcher = (_func_int **)&PTR__ExpressionMatcher_019cb198;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar3->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_18);
  if (local_18._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_18._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pCVar3 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_20);
  _Var2._M_head_impl = local_20._M_head_impl;
  pCVar3->policy = SOME;
  local_20._M_head_impl = (ExpressionMatcher *)0x0;
  _Var1._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_20._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_20._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  return;
}

Assistant:

ConjunctionSimplificationRule::ConjunctionSimplificationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on a ComparisonExpression that has a ConstantExpression as a check
	auto op = make_uniq<ConjunctionExpressionMatcher>();
	op->matchers.push_back(make_uniq<FoldableConstantMatcher>());
	op->policy = SetMatcher::Policy::SOME;
	root = std::move(op);
}